

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall
QSslSocket::setPrivateKey
          (QSslSocket *this,QString *fileName,KeyAlgorithm algorithm,EncodingFormat format,
          QByteArray *passPhrase)

{
  bool bVar1;
  ulong uVar2;
  QSslSocketPrivate *this_00;
  KeyType in_EDX;
  QString *in_RSI;
  QLoggingCategory *in_RDI;
  QMessageLogger *in_R8;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QSslKey key;
  QFile file;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QLoggingCategory *encoded;
  QSslKey *in_stack_ffffffffffffff60;
  char local_60 [40];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  encoded = in_RDI;
  QFile::QFile((QFile *)&local_38,in_RSI);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff30,
             (OpenModeFlag)((ulong)in_RDI >> 0x20));
  uVar2 = QFile::open((QFlags_conflict *)&local_38);
  if ((uVar2 & 1) == 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_stack_ffffffffffffff30,in_RDI);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a288d);
      QMessageLogger::QMessageLogger
                (in_R8,(char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(char *)in_RDI,(char *)0x3a28a3);
      QMessageLogger::warning(local_60,"QSslSocket::setPrivateKey: Couldn\'t open file for reading")
      ;
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    QIODevice::readAll();
    QSslKey::QSslKey(in_stack_ffffffffffffff60,(QByteArray *)encoded,
                     (KeyAlgorithm)((ulong)in_RSI >> 0x20),(EncodingFormat)in_RSI,in_EDX,
                     (QByteArray *)in_R8);
    QByteArray::~QByteArray((QByteArray *)0x3a2914);
    bVar1 = QSslKey::isNull((QSslKey *)in_RDI);
    if (bVar1) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(in_stack_ffffffffffffff30,in_RDI);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a297a);
        QMessageLogger::QMessageLogger
                  (in_R8,(char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(char *)in_RDI,(char *)0x3a2990);
        QMessageLogger::warning
                  (&stack0xffffffffffffff60,
                   "QSslSocket::setPrivateKey: The specified file does not contain a valid key");
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
    else {
      this_00 = d_func((QSslSocket *)0x3a29c0);
      QSslKey::operator=((QSslKey *)this_00,(QSslKey *)in_RDI);
    }
    QSslKey::~QSslKey((QSslKey *)0x3a29f1);
  }
  QFile::~QFile((QFile *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocket::setPrivateKey(const QString &fileName, QSsl::KeyAlgorithm algorithm,
                               QSsl::EncodingFormat format, const QByteArray &passPhrase)
{
    QFile file(fileName);
    if (!file.open(QIODevice::ReadOnly)) {
        qCWarning(lcSsl, "QSslSocket::setPrivateKey: Couldn't open file for reading");
        return;
    }

    QSslKey key(file.readAll(), algorithm, format, QSsl::PrivateKey, passPhrase);
    if (key.isNull()) {
        qCWarning(lcSsl, "QSslSocket::setPrivateKey: "
                         "The specified file does not contain a valid key");
        return;
    }

    Q_D(QSslSocket);
    d->configuration.privateKey = key;
}